

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall
wasm::BinaryInstWriter::emitMemoryAccess
          (BinaryInstWriter *this,size_t alignment,size_t bytes,uint64_t offset,Name memory)

{
  uint extraout_EAX;
  uint32_t uVar1;
  Memory *pMVar2;
  uint64_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  double in_XMM0_Qa;
  LEB<unsigned_long,_unsigned_char> local_38;
  
  __n = offset;
  Bits::log2(in_XMM0_Qa);
  uVar1 = WasmBinaryWriter::getMemoryIndex(this->parent,memory);
  local_38.value._0_4_ = extraout_EAX | 0x40;
  if (uVar1 == 0) {
    local_38.value._0_4_ = extraout_EAX;
  }
  LEB<unsigned_int,_unsigned_char>::write
            ((LEB<unsigned_int,_unsigned_char> *)&local_38,(int)this->o,__buf,__n);
  if (uVar1 != 0) {
    local_38.value._0_4_ = uVar1;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_38,(int)this->o,__buf_00,__n);
  }
  pMVar2 = Module::getMemory(this->parent->wasm,memory);
  __fd = (int)this->o;
  if ((pMVar2->addressType).id == 3) {
    local_38.value = offset;
    LEB<unsigned_long,_unsigned_char>::write(&local_38,__fd,__buf_01,__n);
  }
  else {
    local_38.value._0_4_ = (int)offset;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_38,__fd,__buf_01,__n);
  }
  return;
}

Assistant:

void BinaryInstWriter::emitMemoryAccess(size_t alignment,
                                        size_t bytes,
                                        uint64_t offset,
                                        Name memory) {
  uint32_t alignmentBits = Bits::log2(alignment ? alignment : bytes);
  uint32_t memoryIdx = parent.getMemoryIndex(memory);
  if (memoryIdx > 0) {
    // Set bit 6 in the alignment to indicate a memory index is present per:
    // https://github.com/WebAssembly/multi-memory/blob/main/proposals/multi-memory/Overview.md
    alignmentBits = alignmentBits | 1 << 6;
  }
  o << U32LEB(alignmentBits);
  if (memoryIdx > 0) {
    o << U32LEB(memoryIdx);
  }

  bool memory64 = parent.getModule()->getMemory(memory)->is64();
  if (memory64) {
    o << U64LEB(offset);
  } else {
    o << U32LEB(offset);
  }
}